

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::GroupAssignmentRecord(GroupAssignmentRecord *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__GroupAssignmentRecord_00226b08
  ;
  this->m_ui32GrpBtField = 0;
  EntityIdentifier::EntityIdentifier(&this->m_Entity);
  this->m_ui16DstCommsDvcID = 0;
  this->m_ui8DstLineID = '\0';
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  return;
}

Assistant:

GroupAssignmentRecord::GroupAssignmentRecord() :
    m_ui32GrpBtField( 0 ),
    m_ui16DstCommsDvcID( 0 ),
    m_ui8DstLineID( 0 ),
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 )
{
}